

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>_>
* Lib::
  iterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>>>>
            (CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>
             *i)

{
  CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>
  *in_RDI;
  CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>
  *in_stack_ffffffffffffffa8;
  CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>
  *in_stack_ffffffffffffffc8;
  CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>
  *in_stack_ffffffffffffffd0;
  
  CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>_>
  ::CatIterator(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>_>_>
  ::IterTraits((IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>_>
                *)in_RDI,in_stack_ffffffffffffffa8);
  CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>_>
  ::~CatIterator(in_RDI);
  return (IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>_>
          *)in_RDI;
}

Assistant:

IterTraits<Iter> iterTraits(Iter i) { return IterTraits<Iter>(std::move(i)); }